

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O1

bool deqp::egl::anon_unknown_3::checkVersionQueries(TestLog *log,Functions *gl,int major,int minor)

{
  ostringstream *poVar1;
  int iVar2;
  GLenum GVar3;
  deInt32 minorVersion;
  deInt32 majorVersion;
  GLint local_1c4;
  int local_1c0;
  GLint local_1bc;
  TestLog *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1bc = 0;
  local_1c4 = 0;
  local_1c0 = minor;
  local_1b8 = log;
  (*gl->getIntegerv)(0x821b,&local_1bc);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                  ,0x27c);
  (*gl->getIntegerv)(0x821c,&local_1c4);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                  ,0x27f);
  iVar2 = local_1c0;
  if (local_1bc < major) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = local_1b8;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"glGetIntegerv(GL_MAJOR_VERSION) returned \'",0x2a);
    std::ostream::operator<<(poVar1,local_1bc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\' expected at least \'",0x15);
    std::ostream::operator<<(poVar1,major);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (local_1bc != major) {
      return true;
    }
    if (local_1c0 <= local_1c4) {
      return true;
    }
    if (local_1c0 <= local_1c4) {
      return false;
    }
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = local_1b8;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"glGetIntegerv(GL_MINOR_VERSION) returned \'",0x2a);
    std::ostream::operator<<(poVar1,local_1c4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\' expected \'",0xc);
    std::ostream::operator<<(poVar1,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool checkVersionQueries (TestLog& log, const glw::Functions& gl, int major, int minor)
{
	deInt32 majorVersion = 0;
	deInt32	minorVersion = 0;

	gl.getIntegerv(GL_MAJOR_VERSION, &majorVersion);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

	gl.getIntegerv(GL_MINOR_VERSION, &minorVersion);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

	if (majorVersion < major || (majorVersion == major && minorVersion < minor))
	{
		if (majorVersion < major)
			log << TestLog::Message << "glGetIntegerv(GL_MAJOR_VERSION) returned '" << majorVersion << "' expected at least '" << major << "'" << TestLog::EndMessage;
		else if (majorVersion == major && minorVersion < minor)
			log << TestLog::Message << "glGetIntegerv(GL_MINOR_VERSION) returned '" << minorVersion << "' expected '" << minor << "'" << TestLog::EndMessage;
		else
			DE_ASSERT(false);

		return false;
	}
	else
		return true;
}